

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderRawVariable
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          VariableTag *tag,SizeT *offset)

{
  StringStream<char> *stream;
  bool bVar1;
  Value<char> *this_00;
  RealFormatInfo local_38;
  Value<char> *local_30;
  Value<char> *value;
  SizeT length;
  SizeT t_offset;
  SizeT *offset_local;
  VariableTag *tag_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  value._4_4_ = tag->Offset - 5;
  value._0_4_ = tag->Length + 6;
  _length = offset;
  offset_local = &tag->Offset;
  tag_local = (VariableTag *)this;
  StringStream<char>::Write(this->stream_,this->content_ + *offset,value._4_4_ - *offset);
  *_length = value._4_4_;
  *_length = (SizeT)value + *_length;
  this_00 = getValue(this,(VariableTag *)offset_local);
  local_30 = this_00;
  if (this_00 != (Value<char> *)0x0) {
    stream = this->stream_;
    Digit::RealFormatInfo::RealFormatInfo(&local_38,2,SemiFixed);
    bVar1 = Value<char>::
            CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>,char_const*,unsigned_int)>
                      (this_00,stream,local_38,(_func_void_StringStream<char>_char_ptr_uint *)0x0);
    if (bVar1) {
      return;
    }
  }
  StringStream<char>::Write(this->stream_,this->content_ + value._4_4_,(SizeT)value);
  return;
}

Assistant:

void renderRawVariable(const VariableTag &tag, SizeT &offset) const {
        const SizeT t_offset = (tag.Offset - TagPatterns::RawVariablePrefixLength);
        const SizeT length   = (tag.Length + TagPatterns::RawVariableFullLength);

        stream_->Write((content_ + offset), (t_offset - offset));
        offset = t_offset;
        offset += length;

        const Value_T *value = getValue(tag);

        if ((value == nullptr) ||
            !(value->CopyValueTo(*stream_, {Config::TemplatePrecision, QENTEM_TEMPLATE_DOUBLE_FORMAT}))) {
            stream_->Write((content_ + t_offset), length);
        }
    }